

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutLutBalanceEval(If_Man_t *p,If_Cut_t *pCut)

{
  int LutSize;
  float fVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  int iVar12;
  int iVar13;
  
  uVar3 = *(uint *)&pCut->field_0x1c;
  uVar8 = (uVar3 & 0xffffd000) + (uint)(0x1ffffff < uVar3) + 0x2000;
  *(uint *)&pCut->field_0x1c = uVar8;
  pCut->uMaskFunc = 0;
  if (uVar3 < 0x1000000) {
    if (-1 < pCut->iCutFunc) {
      if ((uint)pCut->iCutFunc < 2) {
        return 0;
      }
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                    ,0x178,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
    }
    goto LAB_00423fec;
  }
  uVar4 = pCut->iCutFunc;
  if ((uVar3 & 0xff000000) == 0x1000000) {
    if (-1 < (int)uVar4) {
      if ((uVar4 & 0x7ffffffe) != 2) {
        __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0x17d,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
      }
      fVar1 = pCut[1].Area;
      if ((-1 < (long)(int)fVar1) && ((int)fVar1 < p->vObjs->nSize)) {
        return (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
      }
LAB_00423f8f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    goto LAB_00423fec;
  }
  if ((int)uVar4 < 0) {
LAB_00423fae:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar6 = uVar3 >> 0x18;
  uVar9 = 6;
  if (6 < uVar6) {
    uVar9 = uVar6;
  }
  uVar9 = uVar9 * (uVar4 >> 1);
  if (p->vTtPerms[uVar6]->nSize <= (int)uVar9) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
  }
  pbVar11 = (byte *)(p->vTtPerms[uVar6]->pArray + uVar9);
  iVar10 = (int)*p->pPars->pLutStruct;
  LutSize = iVar10 + -0x30;
  iVar7 = -1;
  uVar5 = 0;
  uVar9 = 0;
  iVar12 = 0;
  do {
    if ((char)*pbVar11 < '\0') goto LAB_00423fae;
    bVar2 = *pbVar11 >> 1;
    if ((byte)(uVar3 >> 0x18) <= bVar2) {
      __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                    ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
    }
    fVar1 = (&pCut[1].Area)[bVar2];
    if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) goto LAB_00423f8f;
    iVar13 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
    if (iVar7 < iVar13) {
      iVar12 = 1;
      uVar9 = 1 << ((byte)uVar5 & 0x1f);
      iVar7 = iVar13;
    }
    else if (iVar7 == iVar13) {
      iVar12 = iVar12 + 1;
      uVar9 = uVar9 | 1 << ((uint)uVar5 & 0x1f);
    }
    uVar5 = uVar5 + 2;
    pbVar11 = pbVar11 + 1;
  } while (uVar6 * 2 != uVar5);
  if (LutSize < (int)uVar6) {
    *(uint *)&pCut->field_0x1c = uVar8 & 0xfffff000 | 2;
    if (iVar12 <= iVar10 + -0x31) {
      uVar3 = p->vTtDsds[uVar6]->pArray[uVar4 >> 1];
      if ((int)uVar3 < 0) goto LAB_00424049;
      uVar3 = If_DsdManCheckXY(p->pIfDsdMan,uVar3 ^ uVar4 & 1,LutSize,1,uVar9,0,0);
      pCut->uMaskFunc = uVar3;
      if (0 < (int)uVar3) goto LAB_00423f18;
      uVar4 = pCut->iCutFunc;
    }
    if ((int)uVar4 < 0) {
LAB_00423fec:
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                    ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
    }
    uVar3 = p->vTtDsds[(byte)pCut->field_0x1f]->pArray[uVar4 >> 1];
    if ((int)uVar3 < 0) {
LAB_00424049:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = If_DsdManCheckXY(p->pIfDsdMan,uVar3 ^ uVar4 & 1,LutSize,1,0,0,0);
    pCut->uMaskFunc = uVar3;
    uVar3 = iVar7 + 2U | -(uint)(uVar3 == 0);
  }
  else {
LAB_00423f18:
    uVar3 = iVar7 + 1;
  }
  return uVar3;
}

Assistant:

int If_CutLutBalanceEval( If_Man_t * p, If_Cut_t * pCut )
{
    pCut->fUser = 1;
    pCut->Cost = pCut->nLeaves > 1 ? 1 : 0;
    pCut->uMaskFunc = 0;
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int DelayMax = -1, nLeafMax = 0;
        unsigned uLeafMask = 0;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, Abc_Lit2Var((int)pCutPerm[i])))->Delay; 
            if ( DelayMax < pTimes[i] )
                DelayMax = pTimes[i], nLeafMax = 1, uLeafMask = (1 << (i << 1));
            else if ( DelayMax == pTimes[i] )
                nLeafMax++, uLeafMask |= (1 << (i << 1));
        }
        if ( If_CutLeaveNum(pCut) <= LutSize )
            return DelayMax + 1;
        pCut->Cost = 2;
        if ( nLeafMax <= LutSize - 1 )
        {
            pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, uLeafMask, 0, 0 );
            if ( pCut->uMaskFunc > 0 )
                return DelayMax + 1;
        }
        pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, 0, 0, 0 );
        if ( pCut->uMaskFunc == 0 )
            return -1;
        return DelayMax + 2;
    }
}